

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.c
# Opt level: O0

void uv__stream_flush_write_queue(uv_stream_t *stream,int error)

{
  int iVar1;
  uv__queue *q_00;
  uv__queue *q;
  uv_write_t *req;
  int error_local;
  uv_stream_t *stream_local;
  
  while( true ) {
    iVar1 = uv__queue_empty(&stream->write_queue);
    if (iVar1 != 0) break;
    q_00 = uv__queue_head(&stream->write_queue);
    uv__queue_remove(q_00);
    *(int *)((long)&q_00[2].next + 4) = error;
    uv__queue_insert_tail(&stream->write_completed_queue,q_00);
  }
  return;
}

Assistant:

void uv__stream_flush_write_queue(uv_stream_t* stream, int error) {
  uv_write_t* req;
  struct uv__queue* q;
  while (!uv__queue_empty(&stream->write_queue)) {
    q = uv__queue_head(&stream->write_queue);
    uv__queue_remove(q);

    req = uv__queue_data(q, uv_write_t, queue);
    req->error = error;

    uv__queue_insert_tail(&stream->write_completed_queue, &req->queue);
  }
}